

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

Float __thiscall pbrt::ImageChannelValues::operator_cast_to_float(ImageChannelValues *this)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  int va;
  size_t vb;
  
  va = 1;
  vb = (this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).nStored;
  if (vb == 1) {
    paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
              *)(this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
    paVar2 = &(this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).
              field_2;
    if (paVar1 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                   *)0x0) {
      paVar2 = paVar1;
    }
    return paVar2->fixed[0];
  }
  LogFatal<char_const(&)[2],char_const(&)[7],char_const(&)[2],int&,char_const(&)[7],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
             ,0xbd,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x2cb3628,
             (char (*) [7])0x3f1b68,(char (*) [2])0x2cb3628,&va,(char (*) [7])0x3f1b68,&vb);
}

Assistant:

operator Float() const {
        CHECK_EQ(1, size());
        return (*this)[0];
    }